

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O3

bool spvParseTargetEnv(char *s,spv_target_env_conflict *env)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  spv_target_env_conflict sVar4;
  size_t __n;
  long lVar5;
  
  lVar5 = 8;
  do {
    if (s != (char *)0x0) {
      __s = *(char **)((long)pygen_variable_CLDEBUG100_DebugOperationEntries[9].operandTypes +
                      lVar5 + 0x40);
      __n = strlen(__s);
      iVar3 = strncmp(s,__s,__n);
      if (iVar3 == 0) {
        if (env == (spv_target_env_conflict *)0x0) {
          return true;
        }
        sVar4 = *(spv_target_env_conflict *)((long)&spvTargetEnvNameMap[0].first + lVar5);
        bVar1 = true;
        goto LAB_0062277a;
      }
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x1a8);
  bVar2 = false;
  sVar4 = EBadProfile;
  bVar1 = false;
  if (env != (spv_target_env_conflict *)0x0) {
LAB_0062277a:
    bVar2 = bVar1;
    *env = sVar4;
  }
  return bVar2;
}

Assistant:

bool spvParseTargetEnv(const char* s, spv_target_env* env) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  for (auto& name_env : spvTargetEnvNameMap) {
    if (match(name_env.first)) {
      if (env) {
        *env = name_env.second;
      }
      return true;
    }
  }
  if (env) *env = SPV_ENV_UNIVERSAL_1_0;
  return false;
}